

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

Iterator<short,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<short,_true,_std::allocator<unsigned_long>_>::operator++
          (Iterator<short,_true,_std::allocator<unsigned_long>_> *this)

{
  View<short,_true,_std::allocator<unsigned_long>_> *pVVar1;
  pointer puVar2;
  size_t sVar3;
  size_t sVar4;
  reference psVar5;
  runtime_error *this_00;
  pointer puVar6;
  size_t dimension;
  long lVar7;
  unsigned_long uVar8;
  bool bVar9;
  
  pVVar1 = this->view_;
  if (pVVar1 == (View<short,_true,_std::allocator<unsigned_long>_> *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_0021d2e7:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->index_ < *(ulong *)(pVVar1 + 0x30)) {
    this->index_ = this->index_ + 1;
    View<short,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
    if (pVVar1[0x3c] == (View<short,_true,_std::allocator<unsigned_long>_>)0x1) {
      this->pointer_ = this->pointer_ + 1;
    }
    else {
      pVVar1 = this->view_;
      if (this->index_ < *(ulong *)(pVVar1 + 0x30)) {
        View<short,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        puVar6 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar2 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (*(int *)(pVVar1 + 0x38) == 1) {
          if (puVar2 != puVar6) {
            dimension = 0;
            do {
              uVar8 = puVar6[dimension];
              sVar3 = View<short,_true,_std::allocator<unsigned_long>_>::shape
                                (this->view_,dimension);
              sVar4 = View<short,_true,_std::allocator<unsigned_long>_>::strides
                                (this->view_,dimension);
              if (uVar8 != sVar3 - 1) goto LAB_0021d2a5;
              puVar6 = (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              this->pointer_ = this->pointer_ + -(sVar4 * puVar6[dimension]);
              puVar6[dimension] = 0;
              dimension = dimension + 1;
            } while (dimension <
                     (ulong)((long)(this->coordinates_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3));
          }
        }
        else {
          lVar7 = (long)puVar2 - (long)puVar6 >> 3;
          dimension = lVar7 - 1;
          uVar8 = puVar6[lVar7 + -1];
          while (sVar4 = View<short,_true,_std::allocator<unsigned_long>_>::shape
                                   (this->view_,dimension), uVar8 == sVar4 - 1) {
            sVar4 = View<short,_true,_std::allocator<unsigned_long>_>::strides
                              (this->view_,dimension);
            puVar6 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this->pointer_ = this->pointer_ + -(sVar4 * puVar6[dimension]);
            puVar6[dimension] = 0;
            bVar9 = dimension == 0;
            dimension = dimension - 1;
            if (bVar9) goto LAB_0021d2b4;
            uVar8 = puVar6[dimension];
          }
          sVar4 = View<short,_true,_std::allocator<unsigned_long>_>::strides(this->view_,dimension);
LAB_0021d2a5:
          this->pointer_ = this->pointer_ + sVar4;
          puVar6 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + dimension;
          *puVar6 = *puVar6 + 1;
        }
      }
      else {
        psVar5 = View<short,_true,_std::allocator<unsigned_long>_>::operator()
                           (pVVar1,*(ulong *)(pVVar1 + 0x30) - 1);
        this->pointer_ = psVar5 + 1;
        pVVar1 = this->view_;
        View<short,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if (*(int *)(pVVar1 + 0x38) == 1) {
          puVar6 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar6 = *puVar6 + 1;
        }
        else {
          if (*(long *)this->view_ == 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0021d2e7;
          }
          puVar6 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + *(long *)(this->view_ + 0x28) + -1;
          *puVar6 = *puVar6 + 1;
        }
      }
    }
  }
LAB_0021d2b4:
  testInvariant(this);
  return this;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator++()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    if(index_ < view_->size()) { // view initialized and iterator not at the end
        ++index_;
        if(view_->isSimple()) {
            ++pointer_;
        }
        else {
            if(index_ < view_->size()) {
                if(view_->coordinateOrder() == LastMajorOrder) {
                    for(std::size_t j=0; j<coordinates_.size(); ++j) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                    }
                }
                else { // FirstMajorOrder
                    std::size_t j = coordinates_.size() - 1;
                    for(;;) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                        if(j == 0) {
                            break;
                        }
                        else {
                            --j;
                        }
                    }
                }
            }
            else {
                // set to end iterator
                pointer_ = &((*view_)(view_->size()-1)) + 1;
                if(view_->coordinateOrder() == LastMajorOrder) {
                    ++coordinates_[0];
                }
                else { // FirstMajorOrder
                    ++coordinates_[view_->dimension()-1];
                }
            }
        }
    }
    testInvariant();
    return *this;
}